

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::chooseColumn_slice(HDual *this,HVector *row_ep)

{
  HTimer *in_RDI;
  HDualRow *unaff_retaddr;
  int i_1;
  int i;
  HDualRow *in_stack_00000030;
  HVector *in_stack_00000038;
  HDualRow *in_stack_00000040;
  HVector *in_stack_00000070;
  HVector *in_stack_00000078;
  HMatrix *in_stack_00000080;
  HDualRow *in_stack_00000100;
  int in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  HTimer *otherRow;
  
  if (*(int *)((long)in_RDI->itemTicks + 0x7c) == 0) {
    otherRow = in_RDI;
    HTimer::recordStart(in_RDI,in_stack_ffffffffffffffdc);
    HDualRow::clear((HDualRow *)(in_RDI[1].itemStart + 2));
    in_RDI[1].itemStart[0x15] = *(double *)&in_RDI[1].field_0x1e0;
    HDualRow::create_Freemove(in_stack_00000040,in_stack_00000038);
    HDualRow::choose_makepack((HDualRow *)this,row_ep,i);
    HDualRow::choose_possible(in_stack_00000030);
    for (local_14 = 0; local_14 < *(int *)&in_RDI[1].field_0x214; local_14 = local_14 + 1) {
      HVector::clear((HVector *)unaff_retaddr);
      HMatrix::price_by_row(in_stack_00000080,in_stack_00000078,in_stack_00000070);
      HDualRow::clear((HDualRow *)(in_RDI[0x1e].itemTicks + (long)local_14 * 0x1d + 8));
      *(undefined8 *)(&in_RDI[0x1e].field_0x1b8 + (long)local_14 * 0xe8) =
           *(undefined8 *)&in_RDI[1].field_0x1e0;
      HDualRow::choose_makepack((HDualRow *)this,row_ep,i);
      HDualRow::choose_possible(in_stack_00000030);
    }
    for (local_18 = 0; local_18 < *(int *)&in_RDI[1].field_0x214; local_18 = local_18 + 1) {
      HDualRow::choose_joinpack(unaff_retaddr,(HDualRow *)otherRow);
    }
    *(undefined4 *)&in_RDI[1].field_0x1dc = 0xffffffff;
    if ((in_RDI[1].itemStart[0x17] <= 0.0) || (*(int *)((long)in_RDI[1].itemStart + 0xc4) == 0)) {
      *(undefined4 *)((long)in_RDI->itemTicks + 0x7c) = 5;
    }
    else {
      HTimer::recordFinish(in_RDI,in_stack_ffffffffffffffdc);
      HDualRow::choose_final(in_stack_00000100);
      HDualRow::delete_Freemove(unaff_retaddr);
      *(undefined4 *)&in_RDI[1].field_0x1dc = *(undefined4 *)(in_RDI[1].itemStart + 0x18);
      *(double *)&in_RDI[1].field_0x200 = in_RDI[1].itemStart[0x16];
      *(double *)&in_RDI[1].field_0x1e8 = in_RDI[1].itemStart[0x17];
    }
  }
  return;
}

Assistant:

void HDual::chooseColumn_slice(HVector *row_ep) {
	if (invertHint)
		return;

	model->timer.recordStart(HTICK_CHUZC1);
	dualRow.clear();
	dualRow.workDelta = deltaPrimal;
	dualRow.create_Freemove(row_ep);

	// Row_ep:         PACK + CC1
#pragma omp task
	{

		dualRow.choose_makepack(row_ep, numCol);
		dualRow.choose_possible();
	}

	// Row_ap: PRICE + PACK + CC1
	for (int i = 0; i < slice_num; i++) {
#pragma omp task
		{
			slice_row_ap[i].clear();
			slice_matrix[i].price_by_row(slice_row_ap[i], *row_ep);

			slice_dualRow[i].clear();
			slice_dualRow[i].workDelta = deltaPrimal;
			slice_dualRow[i].choose_makepack(&slice_row_ap[i], slice_start[i]);
			slice_dualRow[i].choose_possible();
		}
	}
#pragma omp taskwait

	// Join CC1 results here
	for (int i = 0; i < slice_num; i++)
		dualRow.choose_joinpack(&slice_dualRow[i]);

	// Infeasible we created before
	columnIn = -1;
	if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
   	  invertHint = invertHint_possiblyDualUnbounded; // Was 1
		return;
	}
	model->timer.recordFinish(HTICK_CHUZC1);

	// Choose column 2, This only happens if didn't go out
	dualRow.choose_final();
	dualRow.delete_Freemove();
	columnIn = dualRow.workPivot;
	alphaRow = dualRow.workAlpha;
	thetaDual = dualRow.workTheta;
}